

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::ConvertLights(FBXConverter *this,Model *model,string *orig_name)

{
  pointer ppNVar1;
  Light *light;
  pointer ppNVar2;
  
  ppNVar1 = (model->attributes).
            super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppNVar2 = (model->attributes).
                 super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppNVar2 != ppNVar1;
      ppNVar2 = ppNVar2 + 1) {
    if (*ppNVar2 != (NodeAttribute *)0x0) {
      light = (Light *)__dynamic_cast(*ppNVar2,&NodeAttribute::typeinfo,&Light::typeinfo,0);
      if (light != (Light *)0x0) {
        ConvertLight(this,light,orig_name);
      }
    }
  }
  return;
}

Assistant:

void FBXConverter::ConvertLights(const Model& model, const std::string &orig_name) {
            const std::vector<const NodeAttribute*>& node_attrs = model.GetAttributes();
            for (const NodeAttribute* attr : node_attrs) {
                const Light* const light = dynamic_cast<const Light*>(attr);
                if (light) {
                    ConvertLight(*light, orig_name);
                }
            }
        }